

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lyd_node * lyd_new_dummy(lyd_node *root,lyd_node *parent,lys_node *schema,char *value,int dflt)

{
  LYS_NODE LVar1;
  lys_node *schema_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ly_set *set;
  lyd_node *node;
  LY_ERR *pLVar5;
  lyd_node **pplVar6;
  lyd_node *plVar7;
  lyd_node *plVar8;
  ulong uVar9;
  bool bVar10;
  
  if (schema == (lys_node *)0x0) {
    __assert_fail("schema",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x5ff,
                  "struct lyd_node *lyd_new_dummy(struct lyd_node *, struct lyd_node *, const struct lys_node *, const char *, int)"
                 );
  }
  if ((schema->nodetype & 0xc1bd) == LYS_UNKNOWN) {
    __assert_fail("schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0x601,
                  "struct lyd_node *lyd_new_dummy(struct lyd_node *, struct lyd_node *, const struct lys_node *, const char *, int)"
                 );
  }
  set = ly_set_new();
  if (set == (ly_set *)0x0) {
    pLVar5 = ly_errno_location();
    *pLVar5 = LY_EMEM;
    plVar8 = (lyd_node *)0x0;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_new_dummy");
  }
  else {
    if (root != (lyd_node *)0x0 && parent == (lyd_node *)0x0) {
      do {
        pplVar6 = &root->parent;
        plVar7 = root;
        root = *pplVar6;
      } while (*pplVar6 != (lyd_node *)0x0);
      do {
        root = plVar7;
        plVar7 = root->prev;
      } while (root->prev->next != (lyd_node *)0x0);
    }
    for (; schema != (lys_node *)0x0; schema = lys_parent(schema)) {
      if ((parent != (lyd_node *)0x0) && (parent->schema == schema)) {
        uVar2 = set->number;
        if (set->number == 0) goto LAB_00157c3b;
        goto LAB_00157c64;
      }
      if ((schema->nodetype & 0xc1bd) != LYS_UNKNOWN) {
        ly_set_add(set,schema,1);
      }
    }
    uVar3 = set->number;
    if (uVar3 == 0) {
LAB_00157c3b:
      __assert_fail("spath->number > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                    ,0x61d,
                    "struct lyd_node *lyd_new_dummy(struct lyd_node *, struct lyd_node *, const struct lys_node *, const char *, int)"
                   );
    }
    uVar2 = uVar3;
    if (parent == (lyd_node *)0x0) {
      if (((set->set).s[uVar3 - 1]->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) {
        for (; (parent = (lyd_node *)0x0, uVar2 = uVar3, root != (lyd_node *)0x0 &&
               (parent = root, uVar2 = uVar3 - 1, root->schema != (set->set).s[uVar3 - 1]));
            root = root->next) {
        }
      }
      else {
        parent = (lyd_node *)0x0;
      }
    }
LAB_00157c64:
    bVar10 = parent != (lyd_node *)0x0;
    while ((uVar3 = uVar2, plVar7 = parent, bVar10 && (uVar3 != 0))) {
      if (((set->set).s[uVar3 - 1]->nodetype & LYS_LEAFLIST) != LYS_UNKNOWN) break;
      pplVar6 = &plVar7->child;
      while( true ) {
        plVar8 = *pplVar6;
        bVar10 = plVar8 != (lyd_node *)0x0;
        parent = plVar7;
        uVar2 = uVar3;
        if ((plVar8 == (lyd_node *)0x0) ||
           (parent = plVar8, uVar2 = uVar3 - 1, plVar8->schema == (set->set).s[uVar3 - 1])) break;
        pplVar6 = &plVar8->next;
      }
    }
    uVar9 = (ulong)uVar3;
    plVar8 = (lyd_node *)0x0;
    while (bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
      schema_00 = (set->set).s[uVar9];
      LVar1 = schema_00->nodetype;
      if (LVar1 == LYS_CONTAINER) {
LAB_00157d0e:
        node = _lyd_new(plVar7,schema_00,dflt);
LAB_00157d1c:
        plVar7 = node;
        if (node == (lyd_node *)0x0) {
          pLVar5 = ly_errno_location();
          *pLVar5 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                 ,0x652);
LAB_00157d99:
          ly_set_free(set);
          lyd_free(plVar8);
          return (lyd_node *)0x0;
        }
      }
      else {
        if (LVar1 != LYS_LEAF) {
          if (LVar1 != LYS_ANYDATA) {
            if (LVar1 == LYS_LIST) goto LAB_00157d0e;
            if (LVar1 != LYS_ANYXML) {
              if (LVar1 != LYS_LEAFLIST) goto LAB_00157d99;
              goto LAB_00157ce5;
            }
          }
          node = lyd_create_anydata(plVar7,schema_00,"",LYD_ANYDATA_CONSTSTRING);
          goto LAB_00157d1c;
        }
LAB_00157ce5:
        if (value != (char *)0x0) {
          node = _lyd_new_leaf(plVar7,schema_00,value,dflt);
          goto LAB_00157d1c;
        }
        node = lyd_create_leaf(schema_00,(char *)0x0,dflt);
        if ((node == (lyd_node *)0x0) || (plVar7 == (lyd_node *)0x0)) goto LAB_00157d1c;
        iVar4 = lyd_insert(plVar7,node);
        plVar7 = node;
        if (iVar4 != 0) {
          lyd_free(node);
          goto LAB_00157d99;
        }
      }
      plVar7->validity = 0x80;
      if (plVar8 == (lyd_node *)0x0) {
        plVar8 = plVar7;
      }
    }
    ly_set_free(set);
  }
  return plVar8;
}

Assistant:

struct lyd_node *
lyd_new_dummy(struct lyd_node *root, struct lyd_node *parent, const struct lys_node *schema, const char *value, int dflt)
{
    unsigned int index;
    struct ly_set *spath;
    const struct lys_node *siter;
    struct lyd_node *iter, *dummy = NULL;

    assert(schema);
    assert(schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF |
                               LYS_RPC | LYS_ACTION));

    spath = ly_set_new();
    if (!spath) {
        LOGMEM;
        return NULL;
    }

    if (!parent && root) {
        /* find data root */
        for (; root->parent; root = root->parent);   /* vertical move (up) */
        for (; root->prev->next; root = root->prev); /* horizontal move (left) */
    }

    /* build schema path */
    for (siter = schema; siter; siter = lys_parent(siter)) {
        /* stop if we know some of the parents */
        if (parent && parent->schema == siter) {
            break;
        }

        if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF |
                               LYS_RPC | LYS_ACTION)) {
            /* we have a node that can appear in data tree */
            ly_set_add(spath, (void*)siter, LY_SET_OPT_USEASLIST);
        } /* else skip the rest node types */
    }

    assert(spath->number > 0);
    index = spath->number;
    if (!parent && !(spath->set.s[index - 1]->nodetype & LYS_LEAFLIST)) {
        /* start by searching for the top-level parent */
        LY_TREE_FOR(root, iter) {
            if (iter->schema == spath->set.s[index - 1]) {
                parent = iter;
                index--;
                break;
            }
        }
    }

    iter = parent;
    while (iter && index && !(spath->set.s[index - 1]->nodetype & LYS_LEAFLIST)) {
        /* search for closer parent on the path */
        LY_TREE_FOR(parent->child, iter) {
            if (iter->schema == spath->set.s[index - 1]) {
                index--;
                parent = iter;
                break;
            }
        }
    }
    while(index) {
        /* create the missing part of the path */
        switch (spath->set.s[index - 1]->nodetype) {
        case LYS_LEAF:
        case LYS_LEAFLIST:
            if (value) {
                iter = _lyd_new_leaf(parent, spath->set.s[index - 1], value, dflt);
            } else {
                iter = lyd_create_leaf(spath->set.s[index - 1], value, dflt);
                if (iter && parent) {
                    if (lyd_insert(parent, iter)) {
                        lyd_free(iter);
                        goto error;
                    }
                }
            }
            break;
        case LYS_CONTAINER:
        case LYS_LIST:
            iter = _lyd_new(parent, spath->set.s[index - 1], dflt);
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            iter = lyd_create_anydata(parent, spath->set.s[index - 1], "", LYD_ANYDATA_CONSTSTRING);
            break;
        default:
            goto error;
        }
        if (!iter) {
            LOGINT;
            goto error;
        }

        /* we say it is valid and it is dummy */
        iter->validity = LYD_VAL_INUSE;

        if (!dummy) {
            dummy = iter;
        }

        /* continue */
        parent = iter;
        index--;
    }

    ly_set_free(spath);


    return dummy;

error:
    ly_set_free(spath);
    lyd_free(dummy);
    return NULL;
}